

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

bool __thiscall internalJSONNode::operator_cast_to_bool(internalJSONNode *this)

{
  double dVar1;
  undefined1 uVar2;
  
  Fetch(this);
  if (this->_type == '\0') {
    uVar2 = 0;
  }
  else if (this->_type == '\x02') {
    dVar1 = (this->_value)._number;
    uVar2 = dVar1 <= -1e-05;
    if (0.0 < dVar1) {
      uVar2 = 1e-05 <= dVar1;
    }
  }
  else {
    uVar2 = (this->_value)._bool;
  }
  return (bool)uVar2;
}

Assistant:

internalJSONNode::operator bool() const json_nothrow {
    Fetch();
    #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
	   switch(type()){
		  case JSON_NUMBER:
			 return !_floatsAreEqual(_value._number, (json_number)0.0);
		  case JSON_NULL:
			 return false;
	   }
    #endif /*<- */
    JSON_ASSERT(type() == JSON_BOOL, json_global(ERROR_UNDEFINED) + JSON_TEXT("(bool)"));
    return _value._bool;
}